

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::InvocationInterlockPlacementPass::Process(InvocationInterlockPlacementPass *this)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  Module *pMVar4;
  size_type sVar5;
  size_type sVar6;
  Instruction *this_00;
  Function *entry_func_00;
  pair<std::__detail::_Node_iterator<spvtools::opt::Function_*,_true,_false>,_bool> pVar7;
  ExecutionModel execution_model;
  Function *entry_func;
  uint32_t entry_id_1;
  Instruction *entry_inst_1;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  Function *func;
  undefined1 local_b8 [8];
  iterator fi;
  Function *local_98;
  uint32_t local_8c;
  Instruction *pIStack_88;
  uint32_t entry_id;
  Instruction *entry_inst;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
  entry_points;
  bool modified;
  InvocationInterlockPlacementPass *this_local;
  
  bVar1 = isFragmentShaderInterlockEnabled(this);
  if (bVar1) {
    entry_points._M_h._M_single_bucket._7_1_ = 0;
    std::
    unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
    ::unordered_set((unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
                     *)&__range2);
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::module(pIVar3);
    Module::entry_points((Module *)&__begin2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::end
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry_inst);
    while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&entry_inst),
          bVar1) {
      pIStack_88 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
      local_8c = opt::Instruction::GetSingleWordInOperand(pIStack_88,1);
      pIVar3 = Pass::context(&this->super_Pass);
      local_98 = IRContext::GetFunction(pIVar3,local_8c);
      pVar7 = std::
              unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
              ::insert((unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
                        *)&__range2,&local_98);
      fi.iterator_._M_current =
           (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *)
           pVar7.first.super__Node_iterator_base<spvtools::opt::Function_*,_false>._M_cur;
      InstructionList::iterator::operator++(&__end2);
    }
    pIVar3 = Pass::context(&this->super_Pass);
    pMVar4 = IRContext::module(pIVar3);
    _local_b8 = Module::begin(pMVar4);
    while( true ) {
      pIVar3 = Pass::context(&this->super_Pass);
      pMVar4 = IRContext::module(pIVar3);
      _func = Module::end(pMVar4);
      bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_b8,
                         (UptrVectorIterator<spvtools::opt::Function,_false> *)&func);
      if (!bVar1) break;
      __range2_1 = (IteratorRange<spvtools::opt::InstructionList::iterator> *)
                   UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_b8);
      recordBeginOrEndInFunction(this,(Function *)__range2_1);
      sVar5 = std::
              unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
              ::count((unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
                       *)&__range2,(key_type *)&__range2_1);
      if ((sVar5 == 0) &&
         (sVar6 = std::
                  unordered_map<spvtools::opt::Function_*,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>_>
                  ::count(&this->extracted_functions_,(key_type *)&__range2_1), sVar6 != 0)) {
        bVar1 = removeBeginAndEndInstructionsFromFunction(this,(Function *)__range2_1);
        entry_points._M_h._M_single_bucket._7_1_ =
             (entry_points._M_h._M_single_bucket._7_1_ & 1) != 0 || bVar1;
      }
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_b8);
    }
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::module(pIVar3);
    Module::entry_points((Module *)&__begin2_1);
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
    IteratorRange<spvtools::opt::InstructionList::iterator>::end
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry_inst_1);
    while (bVar1 = utils::operator!=(&__end2_1.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&entry_inst_1)
          , bVar1) {
      this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
      uVar2 = opt::Instruction::GetSingleWordInOperand(this_00,1);
      pIVar3 = Pass::context(&this->super_Pass);
      entry_func_00 = IRContext::GetFunction(pIVar3,uVar2);
      uVar2 = opt::Instruction::GetSingleWordInOperand(this_00,0);
      if (uVar2 == 4) {
        bVar1 = processFragmentShaderEntry(this,entry_func_00);
        entry_points._M_h._M_single_bucket._7_1_ =
             (entry_points._M_h._M_single_bucket._7_1_ & 1) != 0 || bVar1;
      }
      InstructionList::iterator::operator++(&__end2_1);
    }
    this_local._4_4_ = SuccessWithoutChange;
    if ((entry_points._M_h._M_single_bucket._7_1_ & 1) != 0) {
      this_local._4_4_ = SuccessWithChange;
    }
    std::
    unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
    ::~unordered_set((unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
                      *)&__range2);
  }
  else {
    this_local._4_4_ = SuccessWithoutChange;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status InvocationInterlockPlacementPass::Process() {
  // Skip this pass if the necessary extension or capability is missing
  if (!isFragmentShaderInterlockEnabled()) {
    return Status::SuccessWithoutChange;
  }

  bool modified = false;

  std::unordered_set<Function*> entry_points;
  for (Instruction& entry_inst : context()->module()->entry_points()) {
    uint32_t entry_id =
        entry_inst.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    entry_points.insert(context()->GetFunction(entry_id));
  }

  for (auto fi = context()->module()->begin(); fi != context()->module()->end();
       ++fi) {
    Function* func = &*fi;
    recordBeginOrEndInFunction(func);
    if (!entry_points.count(func) && extracted_functions_.count(func)) {
      modified |= removeBeginAndEndInstructionsFromFunction(func);
    }
  }

  for (Instruction& entry_inst : context()->module()->entry_points()) {
    uint32_t entry_id =
        entry_inst.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    Function* entry_func = context()->GetFunction(entry_id);

    auto execution_model = spv::ExecutionModel(
        entry_inst.GetSingleWordInOperand(kEntryPointExecutionModelInIdx));

    if (execution_model != spv::ExecutionModel::Fragment) {
      continue;
    }

    modified |= processFragmentShaderEntry(entry_func);
  }

  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}